

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::preprocess_op_codes(CompilerMSL *this)

{
  bool bVar1;
  uint32_t id;
  ExecutionModel EVar2;
  SPIRFunction *func;
  byte local_1dc;
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  byte local_109;
  anon_class_8_1_70607f59 aStack_108;
  bool should_enable;
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [48];
  undefined1 local_a0 [8];
  OpCodePreprocessor preproc;
  CompilerMSL *this_local;
  
  preproc._136_8_ = this;
  OpCodePreprocessor::OpCodePreprocessor((OpCodePreprocessor *)local_a0,this);
  id = TypedID::operator_cast_to_unsigned_int
                 ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  func = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,id);
  Compiler::traverse_all_reachable_opcodes((Compiler *)this,func,(OpcodeHandler *)local_a0);
  this->suppress_missing_prototypes =
       (bool)((byte)preproc.image_pointers_emulated._M_h._M_single_bucket & 1);
  if ((preproc.image_pointers_emulated._M_h._M_single_bucket._1_1_ & 1) != 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_d0,"#include <metal_atomic>",&local_d1);
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,(string *)local_d0);
    ::std::__cxx11::string::~string(local_d0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_f8,"#pragma clang diagnostic ignored \"-Wunused-variable\"",&local_f9);
    add_pragma_line(this,(string *)local_f8);
    ::std::__cxx11::string::~string(local_f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  if ((((preproc.image_pointers_emulated._M_h._M_single_bucket._3_1_ & 1) != 0) &&
      (bVar1 = Options::supports_msl_version(&this->msl_options,2,1,0), !bVar1)) ||
     (((preproc.image_pointers_emulated._M_h._M_single_bucket._2_1_ & 1) != 0 &&
      (bVar1 = Options::supports_msl_version(&this->msl_options,2,2,0), !bVar1)))) {
    this->is_rasterization_disabled = true;
  }
  bVar1 = is_tesc_shader(this);
  if ((bVar1) ||
     ((EVar2 = Compiler::get_execution_model((Compiler *)this), EVar2 == ExecutionModelVertex &&
      (((this->msl_options).vertex_for_tessellation & 1U) != 0)))) {
    this->is_rasterization_disabled = true;
    this->capture_output_to_buffer = true;
  }
  if ((preproc.image_pointers_emulated._M_h._M_single_bucket._5_1_ & 1) != 0) {
    this->needs_local_invocation_index = true;
  }
  if ((preproc.image_pointers_emulated._M_h._M_single_bucket._6_1_ & 1) != 0) {
    this->needs_subgroup_invocation_id = true;
  }
  if ((preproc.image_pointers_emulated._M_h._M_single_bucket._7_1_ & 1) != 0) {
    this->needs_subgroup_size = true;
  }
  if ((((preproc.suppress_missing_prototypes & 1U) != 0) ||
      (((this->msl_options).force_sample_rate_shading & 1U) != 0)) ||
     ((bVar1 = is_sample_rate(this), bVar1 &&
      ((bVar1 = Bitset::get(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0xf),
       bVar1 || ((((this->super_CompilerGLSL).super_Compiler.need_subpass_input_ms & 1U) != 0 &&
                 (((this->msl_options).use_framebuffer_fetch_subpasses & 1U) == 0)))))))) {
    this->needs_sample_id = true;
  }
  if (((preproc.uses_atomics & 1U) != 0) ||
     (bVar1 = Bitset::get(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0x17),
     bVar1)) {
    this->needs_helper_invocation = true;
  }
  aStack_108.preproc = (OpCodePreprocessor *)local_a0;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRBlock,spirv_cross::CompilerMSL::preprocess_op_codes()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&stack0xfffffffffffffef8);
  if (((preproc.image_pointers_emulated._M_h._M_single_bucket._4_1_ & 1) != 0) &&
     (((preproc.image_pointers_emulated._M_h._M_single_bucket._3_1_ & 1) != 0 ||
      ((preproc.image_pointers_emulated._M_h._M_single_bucket._2_1_ & 1) != 0)))) {
    local_1dc = 1;
    if (((this->msl_options).check_discarded_frag_stores & 1U) == 0) {
      local_1dc = (this->msl_options).force_fragment_with_side_effects_execution;
    }
    local_109 = local_1dc & 1;
    this->frag_shader_needs_discard_checks =
         (this->frag_shader_needs_discard_checks & 1U) != 0 ||
         ((this->msl_options).check_discarded_frag_stores & 1U) != 0;
    this->needs_helper_invocation = (this->needs_helper_invocation & 1U) != 0 || local_109 != 0;
    (this->msl_options).manual_helper_invocation_updates =
         ((this->msl_options).manual_helper_invocation_updates & 1U) != 0 || local_109 != 0;
  }
  bVar1 = is_intersection_query(this);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_130,"#if __METAL_VERSION__ >= 230",&local_131);
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,(string *)local_130);
    ::std::__cxx11::string::~string(local_130);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_158,"#include <metal_raytracing>",&local_159);
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,(string *)local_158);
    ::std::__cxx11::string::~string(local_158);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_159);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_180,"using namespace metal::raytracing;",&local_181);
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,(string *)local_180);
    ::std::__cxx11::string::~string(local_180);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1a8,"#endif",&local_1a9);
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,(string *)local_1a8);
    ::std::__cxx11::string::~string(local_1a8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  }
  OpCodePreprocessor::~OpCodePreprocessor((OpCodePreprocessor *)local_a0);
  return;
}

Assistant:

void CompilerMSL::preprocess_op_codes()
{
	OpCodePreprocessor preproc(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), preproc);

	suppress_missing_prototypes = preproc.suppress_missing_prototypes;

	if (preproc.uses_atomics)
	{
		add_header_line("#include <metal_atomic>");
		add_pragma_line("#pragma clang diagnostic ignored \"-Wunused-variable\"");
	}

	// Before MSL 2.1 (2.2 for textures), Metal vertex functions that write to
	// resources must disable rasterization and return void.
	if ((preproc.uses_buffer_write && !msl_options.supports_msl_version(2, 1)) ||
	    (preproc.uses_image_write && !msl_options.supports_msl_version(2, 2)))
		is_rasterization_disabled = true;

	// Tessellation control shaders are run as compute functions in Metal, and so
	// must capture their output to a buffer.
	if (is_tesc_shader() || (get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation))
	{
		is_rasterization_disabled = true;
		capture_output_to_buffer = true;
	}

	if (preproc.needs_local_invocation_index)
		needs_local_invocation_index = true;
	if (preproc.needs_subgroup_invocation_id)
		needs_subgroup_invocation_id = true;
	if (preproc.needs_subgroup_size)
		needs_subgroup_size = true;
	// build_implicit_builtins() hasn't run yet, and in fact, this needs to execute
	// before then so that gl_SampleID will get added; so we also need to check if
	// that function would add gl_FragCoord.
	if (preproc.needs_sample_id || msl_options.force_sample_rate_shading ||
	    (is_sample_rate() && (active_input_builtins.get(BuiltInFragCoord) ||
	                          (need_subpass_input_ms && !msl_options.use_framebuffer_fetch_subpasses))))
		needs_sample_id = true;
	if (preproc.needs_helper_invocation || active_input_builtins.get(BuiltInHelperInvocation))
		needs_helper_invocation = true;

	// OpKill is removed by the parser, so we need to identify those by inspecting
	// blocks.
	ir.for_each_typed_id<SPIRBlock>([&preproc](uint32_t, SPIRBlock &block) {
		if (block.terminator == SPIRBlock::Kill)
			preproc.uses_discard = true;
	});

	// Fragment shaders that both write to storage resources and discard fragments
	// need checks on the writes, to work around Metal allowing these writes despite
	// the fragment being dead. We also require to force Metal to execute fragment
	// shaders instead of being prematurely discarded.
	if (preproc.uses_discard && (preproc.uses_buffer_write || preproc.uses_image_write))
	{
		bool should_enable = (msl_options.check_discarded_frag_stores || msl_options.force_fragment_with_side_effects_execution);
		frag_shader_needs_discard_checks |= msl_options.check_discarded_frag_stores;
		needs_helper_invocation |= should_enable;
		// Fragment discard store checks imply manual HelperInvocation updates.
		msl_options.manual_helper_invocation_updates |= should_enable;
	}

	if (is_intersection_query())
	{
		add_header_line("#if __METAL_VERSION__ >= 230");
		add_header_line("#include <metal_raytracing>");
		add_header_line("using namespace metal::raytracing;");
		add_header_line("#endif");
	}
}